

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int take_off(void)

{
  obj *poVar1;
  obj *poVar2;
  obj *poVar3;
  obj *poVar4;
  obj *poVar5;
  obj *poVar6;
  obj *poVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  obj **ppoVar11;
  obj *poVar12;
  int iVar13;
  long lVar14;
  
  poVar12 = uarm;
  poVar7 = uarmu;
  poVar6 = uarmc;
  poVar5 = uarmh;
  poVar4 = uarms;
  poVar3 = uarmg;
  poVar2 = uarmf;
  poVar1 = uamul;
  if (taking_off != 0) {
    if (0 < todelay) {
      todelay = todelay + -1;
      return 1;
    }
    if (taking_off < 0x100) {
      if (taking_off < 0x10) {
        switch(taking_off) {
        case 1:
          iVar13 = cursed(uarm);
          if (iVar13 == 0) {
            Armor_off();
          }
          break;
        case 2:
          iVar13 = cursed(uarmc);
          poVar12 = poVar6;
          if (iVar13 == 0) {
            Cloak_off();
          }
          break;
        default:
          goto switchD_00188ffc_caseD_3;
        case 4:
          iVar13 = cursed(uarmh);
          poVar12 = poVar5;
          if (iVar13 == 0) {
            Helmet_off();
          }
          break;
        case 8:
          iVar13 = cursed(uarms);
          poVar12 = poVar4;
          if (iVar13 == 0) {
            Shield_off();
          }
        }
      }
      else if (taking_off == 0x10) {
        iVar13 = cursed(uarmg);
        poVar12 = poVar3;
        if (iVar13 == 0) {
          Gloves_off();
        }
      }
      else if (taking_off == 0x20) {
        iVar13 = cursed(uarmf);
        poVar12 = poVar2;
        if (iVar13 == 0) {
          Boots_off();
        }
      }
      else {
        if (taking_off != 0x40) goto switchD_00188ffc_caseD_3;
        iVar13 = cursed(uarmu);
        poVar12 = poVar7;
        if (iVar13 == 0) {
          Shirt_off();
        }
      }
      goto LAB_00189294;
    }
    if (taking_off < 0x10000) {
      if (taking_off == 0x100) {
        iVar13 = cursed(uwep);
        if (iVar13 == 0) {
          setuwep((obj *)0x0);
          pcVar9 = body_part(7);
          pline("You are empty %s.",pcVar9);
          goto LAB_00189286;
        }
LAB_00189216:
        poVar12 = (obj *)0x0;
      }
      else if (taking_off == 0x200) {
        setuqwep((obj *)0x0);
        pline("You no longer have ammunition readied.");
        poVar12 = (obj *)0x0;
      }
      else {
        if (taking_off != 0x400) goto switchD_00188ffc_caseD_3;
        setuswapwep((obj *)0x0);
        pline("You no longer have a second weapon readied.");
LAB_00189286:
        u.twoweap = '\0';
        poVar12 = (obj *)0x0;
      }
    }
    else if (taking_off < 0x40000) {
      if (taking_off == 0x10000) {
        iVar13 = cursed(uamul);
        poVar12 = poVar1;
        if (iVar13 == 0) {
          Amulet_off();
        }
      }
      else {
        if (taking_off == 0x20000) {
          ppoVar11 = &uleft;
          goto LAB_001891bd;
        }
switchD_00188ffc_caseD_3:
        warning("do_takeoff: taking off %lx");
        poVar12 = (obj *)0x0;
      }
    }
    else {
      if (taking_off != 0x40000) {
        if (taking_off == 0x80000) {
          iVar13 = cursed(ublindf);
          if (iVar13 == 0) {
            Blindf_off(ublindf,'\x01');
          }
          goto LAB_00189216;
        }
        goto switchD_00188ffc_caseD_3;
      }
      ppoVar11 = &uright;
LAB_001891bd:
      poVar12 = *ppoVar11;
      iVar13 = cursed(poVar12);
      if (iVar13 == 0) {
        Ring_off_or_gone(*ppoVar11,'\0');
      }
    }
LAB_00189294:
    if (poVar12 != (obj *)0x0) {
      off_msg(poVar12,'\x01');
    }
    takeoff_mask = takeoff_mask & ~taking_off;
    taking_off = 0;
  }
  uVar10 = 0x80000;
  lVar14 = 1;
  do {
    uVar8 = uVar10;
    if ((takeoff_mask & uVar10) != 0) break;
    uVar10 = takeoff_order[lVar14];
    lVar14 = lVar14 + 1;
    uVar8 = taking_off;
  } while (lVar14 != 0xf);
  taking_off = uVar8;
  todelay = 0;
  if (taking_off < 0x40) {
    switch(taking_off) {
    case 0:
      pline("You finish %s.",disrobing);
      return 0;
    case 1:
      poVar12 = uarm;
      if (uarmc == (obj *)0x0) goto LAB_001894dd;
      iVar13 = objects[uarmc->otyp].oc_delay * 2;
LAB_001894cb:
      todelay = iVar13 + 1;
      goto LAB_001894dd;
    case 2:
      ppoVar11 = &uarmc;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_00189352_caseD_3:
      warning("take_off: taking off %lx");
      return 0;
    case 4:
      ppoVar11 = &uarmh;
      break;
    case 8:
      ppoVar11 = &uarms;
      break;
    default:
      if (taking_off == 0x10) {
        ppoVar11 = &uarmg;
      }
      else {
        if (taking_off != 0x20) goto switchD_00189352_caseD_3;
        ppoVar11 = &uarmf;
      }
    }
    poVar12 = *ppoVar11;
    goto LAB_001894dd;
  }
  if (taking_off < 0x10000) {
    if (taking_off < 0x200) {
      if (taking_off == 0x40) {
        if (uarm != (obj *)0x0) {
          todelay = objects[uarm->otyp].oc_delay * 2;
        }
        poVar12 = uarmu;
        if (uarmc == (obj *)0x0) goto LAB_001894dd;
        iVar13 = todelay + objects[uarmc->otyp].oc_delay * 2;
        goto LAB_001894cb;
      }
      if (taking_off != 0x100) goto switchD_00189352_caseD_3;
    }
    else if ((taking_off != 0x200) && (taking_off != 0x400)) goto switchD_00189352_caseD_3;
LAB_001893db:
    todelay = 1;
  }
  else {
    if (taking_off < 0x40000) {
      if ((taking_off != 0x10000) && (taking_off != 0x20000)) goto switchD_00189352_caseD_3;
      goto LAB_001893db;
    }
    if (taking_off == 0x40000) goto LAB_001893db;
    if (taking_off != 0x80000) goto switchD_00189352_caseD_3;
    todelay = 2;
  }
  poVar12 = (obj *)0x0;
LAB_001894dd:
  if (poVar12 != (obj *)0x0) {
    todelay = todelay + objects[poVar12->otyp].oc_delay;
  }
  if (0 < todelay) {
    todelay = todelay + -1;
  }
  set_occupation(take_off,disrobing,0);
  return 1;
}

Assistant:

static int take_off(void)
{
	int i;
	struct obj *otmp;

	if (taking_off) {
	    if (todelay > 0) {
		todelay--;
		return 1;	/* still busy */
	    } else {
		if ((otmp = do_takeoff())) off_msg(otmp, TRUE);
	    }
	    takeoff_mask &= ~taking_off;
	    taking_off = 0L;
	}

	for (i = 0; takeoff_order[i]; i++)
	    if (takeoff_mask & takeoff_order[i]) {
		taking_off = takeoff_order[i];
		break;
	    }

	otmp = NULL;
	todelay = 0;

	if (taking_off == 0L) {
	  pline("You finish %s.", disrobing);
	  return 0;
	} else if (taking_off == W_WEP) {
	  todelay = 1;
	} else if (taking_off == W_SWAPWEP) {
	  todelay = 1;
	} else if (taking_off == W_QUIVER) {
	  todelay = 1;
	} else if (taking_off == WORN_ARMOR) {
	  otmp = uarm;
	  /* If a cloak is being worn, add the time to take it off and put
	   * it back on again.  Kludge alert! since that time is 0 for all
	   * known cloaks, add 1 so that it actually matters...
	   */
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_CLOAK) {
	  otmp = uarmc;
	} else if (taking_off == WORN_BOOTS) {
	  otmp = uarmf;
	} else if (taking_off == WORN_GLOVES) {
	  otmp = uarmg;
	} else if (taking_off == WORN_HELMET) {
	  otmp = uarmh;
	} else if (taking_off == WORN_SHIELD) {
	  otmp = uarms;
	} else if (taking_off == WORN_SHIRT) {
	  otmp = uarmu;
	  /* add the time to take off and put back on armor and/or cloak */
	  if (uarm)  todelay += 2 * objects[uarm->otyp].oc_delay;
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_AMUL) {
	  todelay = 1;
	} else if (taking_off == LEFT_RING) {
	  todelay = 1;
	} else if (taking_off == RIGHT_RING) {
	  todelay = 1;
	} else if (taking_off == WORN_BLINDF) {
	  todelay = 2;
	} else {
	  warning("take_off: taking off %lx", taking_off);
	  return 0;	/* force done */
	}

	if (otmp) todelay += objects[otmp->otyp].oc_delay;

	/* Since setting the occupation now starts the counter next move, that
	 * would always produce a delay 1 too big per item unless we subtract
	 * 1 here to account for it.
	 */
	if (todelay > 0) todelay--;

	set_occupation(take_off, disrobing, 0);
	return 1;		/* get busy */
}